

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

int lest::run(tests *specification,texts *arguments,ostream *os)

{
  pointer ptVar1;
  pointer ptVar2;
  __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_> __first;
  __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_> __last;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int iVar5;
  ulong uVar6;
  pointer pbVar7;
  times *ptVar8;
  confirm *pcVar9;
  size_t __i;
  long lVar10;
  tms *__buffer;
  int in_R8D;
  lest *this;
  tms *specification_00;
  texts in;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_14e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_14e0;
  undefined1 local_14c8 [24];
  vector<lest::test,_std::allocator<lest::test>_> local_14b0;
  undefined1 local_1498 [24];
  vector<lest::test,_std::allocator<lest::test>_> local_1480;
  undefined1 local_1468 [24];
  vector<lest::test,_std::allocator<lest::test>_> local_1450;
  undefined1 local_1438 [24];
  vector<lest::test,_std::allocator<lest::test>_> local_1420;
  undefined1 local_1408 [24];
  vector<lest::test,_std::allocator<lest::test>_> local_13f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_13d8;
  undefined1 local_13b8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_13a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1398;
  _Alloc_hider local_1390;
  unsigned_long local_1388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1380;
  pointer local_1370;
  pointer pbStack_1368;
  pointer local_1360;
  unsigned_long uStack_1358;
  size_t local_38;
  
  local_1508.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1508.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1508.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_14e0,arguments);
  split_arguments((tuple<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_13b8,&local_14e0);
  paVar4 = local_1398;
  paVar3 = local_13a0;
  local_13d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1508.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_13d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1508.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_13d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1508.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pcVar9 = (confirm *)((ulong)local_1398 >> 0x20);
  local_14e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_1390._M_p;
  local_1508.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_13b8._16_8_;
  local_1508.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_13b8._0_8_;
  local_1508.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_13b8._8_8_;
  local_13b8._0_8_ = (pointer)0x0;
  local_13b8._8_8_ = (pointer)0x0;
  local_13b8._16_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_13d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_13b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_14e0);
  if (((ulong)paVar4 & 1) != 0) {
    ptVar1 = (specification->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (specification->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (ptVar1 != ptVar2) {
      uVar6 = (long)ptVar2 - (long)ptVar1 >> 6;
      lVar10 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<lest::test*,std::vector<lest::test,std::allocator<lest::test>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<lest::sort(std::vector<lest::test,std::allocator<lest::test>>&)::_lambda(lest::test_const&,lest::test_const&)_1_>>
                (ptVar1,ptVar2,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<lest::test*,std::vector<lest::test,std::allocator<lest::test>>>,__gnu_cxx::__ops::_Iter_comp_iter<lest::sort(std::vector<lest::test,std::allocator<lest::test>>&)::_lambda(lest::test_const&,lest::test_const&)_1_>>
                (ptVar1,ptVar2);
    }
  }
  if (((ulong)paVar4 & 0x100) != 0) {
    __first._M_current =
         (specification->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (specification->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    local_13b8._0_8_ = (ulong)local_14e8 & 0xffffffff;
    lVar10 = 1;
    pbVar7 = (pointer)local_13b8._0_8_;
    do {
      pbVar7 = (pointer)(ulong)(((uint)((ulong)pbVar7 >> 0x1e) ^ (uint)pbVar7) * 0x6c078965 +
                               (int)lVar10);
      *(pointer *)(local_13b8 + lVar10 * 8) = pbVar7;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x270);
    local_38 = 0x270;
    std::
    shuffle<__gnu_cxx::__normal_iterator<lest::test*,std::vector<lest::test,std::allocator<lest::test>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              (__first,__last,
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)local_13b8);
  }
  if (((ulong)paVar3 & 1) != 0) {
    iVar5 = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              (os,
               "\nUsage: test [options] [test-spec ...]\n\nOptions:\n  -h, --help         this help message\n  -a, --abort        abort at first failure\n  -c, --count        count selected tests\n  -g, --list-tags    list tags of selected tests\n  -l, --list-tests   list selected tests\n  -p, --pass         also report passing tests\n  -z, --pass-zen     ... without expansion\n  -t, --time         list duration of selected tests\n  -v, --verbose      also report passing or failing sections\n  --order=declared   use source code test order (default)\n  --order=lexical    use lexical sort test order\n  --order=random     use random test order\n  --random-seed=n    use n for random generator seed\n  --random-seed=time use time for random generator seed\n  --repeat=n         repeat selected tests n times (-1: indefinite)\n  --version          report lest version and compiler used\n  --                 end options\n\nTest specification:\n  \"@\", \"*\" all tests, unless excluded\n  empty    all tests, unless tagged [hide] or [.optional-name]\n  \"text\"   select tests that contain text (case insensitive)\n  \"!text\"  omit tests that contain text (case insensitive)\n"
               ,0x469);
    goto LAB_00107322;
  }
  if (((ulong)paVar4 & 0x1000000) != 0) {
    iVar5 = version(os);
    goto LAB_00107322;
  }
  if (((ulong)paVar3 & 0x10000) == 0) {
    if (((ulong)paVar3 & 0x1000000) != 0) {
      std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_1420,specification);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1438,&local_1508);
      this = (lest *)&local_1420;
      specification_00 = (tms *)local_1438;
      local_13b8._0_8_ = os;
      for_test<lest::print>(this,(tests *)specification_00,(texts *)local_13b8,(print *)0x1,in_R8D);
      goto LAB_0010730f;
    }
    if (((ulong)paVar3 & 0x100000000) == 0) {
      if (((ulong)paVar3 & 0x10000000000) == 0) {
        std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_14b0,specification);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_14c8,&local_1508);
        local_1390._M_p = (pointer)&local_1380;
        local_13b8._16_8_ = paVar3;
        local_13a0 = paVar4;
        local_1398 = local_14e8;
        local_1388 = 0;
        local_1380._M_local_buf[0] = '\0';
        local_1370 = (pointer)0x0;
        pbStack_1368 = (pointer)0x0;
        local_1360 = (pointer)0x0;
        uStack_1358 = 0;
        this = (lest *)&local_14b0;
        specification_00 = (tms *)local_14c8;
        local_13b8._0_8_ = os;
        local_13b8._8_8_ = os;
        pcVar9 = for_test<lest::confirm>
                           (this,(tests *)specification_00,(texts *)local_13b8,pcVar9,in_R8D);
        iVar5 = pcVar9->failures;
        confirm::~confirm((confirm *)local_13b8);
      }
      else {
        std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_1480,specification);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1498,&local_1508);
        times::times((times *)local_13b8,(tms *)os);
        this = (lest *)&local_1480;
        specification_00 = (tms *)local_1498;
        __buffer = specification_00;
        ptVar8 = for_test<lest::times>
                           (this,(tests *)specification_00,(texts *)local_13b8,(times *)0x1,in_R8D);
        iVar5 = ptVar8->failures;
        times::~times((times *)local_13b8,__buffer);
      }
    }
    else {
      std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_1450,specification);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1468,&local_1508);
      local_1398 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_13b8 + 0x10);
      local_13b8._8_8_ = (pointer)0x0;
      local_13b8._16_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      iVar5 = 0;
      local_13a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
      local_1388 = 0;
      this = (lest *)&local_1450;
      specification_00 = (tms *)local_1468;
      local_13b8._0_8_ = os;
      local_1390._M_p = (pointer)local_1398;
      for_test<lest::ptags>(this,(tests *)specification_00,(texts *)local_13b8,(ptags *)0x1,in_R8D);
      ptags::~ptags((ptags *)local_13b8);
    }
  }
  else {
    std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_13f0,specification);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1408,&local_1508);
    local_13b8._8_8_ = local_13b8._8_8_ & 0xffffffff00000000;
    this = (lest *)&local_13f0;
    specification_00 = (tms *)local_1408;
    local_13b8._0_8_ = os;
    for_test<lest::count>(this,(tests *)specification_00,(texts *)local_13b8,(count *)0x1,in_R8D);
    count::~count((count *)local_13b8);
LAB_0010730f:
    iVar5 = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)specification_00);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector
            ((vector<lest::test,_std::allocator<lest::test>_> *)this);
LAB_00107322:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1508);
  return iVar5;
}

Assistant:

inline int run( tests specification, texts arguments, std::ostream & os = std::cout )
{
    try
    {
        options option; texts in;
        std::tie( option, in ) = split_arguments( arguments );

        if ( option.lexical ) {    sort( specification         ); }
        if ( option.random  ) { shuffle( specification, option ); }

        if ( option.help    ) { return usage   ( os ); }
        if ( option.version ) { return version ( os ); }
        if ( option.count   ) { return for_test( specification, in, count( os ) ); }
        if ( option.list    ) { return for_test( specification, in, print( os ) ); }
        if ( option.tags    ) { return for_test( specification, in, ptags( os ) ); }
        if ( option.time    ) { return for_test( specification, in, times( os, option ) ); }

        return for_test( specification, in, confirm( os, option ), option.repeat );
    }
    catch ( std::exception const & e )
    {
        os << "Error: " << e.what() << "\n";
        return 1;
    }
}